

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetJavaMutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,EnumDescriptor *descriptor)

{
  FileDescriptor *file;
  bool in_CL;
  string local_40;
  EnumDescriptor *local_20;
  EnumDescriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  local_20 = descriptor;
  descriptor_local = (EnumDescriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)descriptor,(EnumDescriptor *)0x0,in_CL);
  file = EnumDescriptor::file(local_20);
  GetJavaClassFullName(__return_storage_ptr__,this,&local_40,file,false);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetJavaMutableClassName(
    const EnumDescriptor* descriptor) {
  return GetJavaClassFullName(ClassNameWithoutPackage(descriptor, false),
                              descriptor->file(), false);
}